

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

MemoryFill * __thiscall
wasm::Builder::makeMemoryFill
          (Builder *this,Expression *dest,Expression *value,Expression *size,Name memory)

{
  MemoryFill *pMVar1;
  MemoryFill *ret;
  Expression *size_local;
  Expression *value_local;
  Expression *dest_local;
  Builder *this_local;
  Name memory_local;
  
  memory_local.super_IString.str._M_len = memory.super_IString.str._M_str;
  this_local = memory.super_IString.str._M_len;
  pMVar1 = MixedArena::alloc<wasm::MemoryFill>((MixedArena *)(this->wasm + 0x200));
  pMVar1->dest = dest;
  pMVar1->value = value;
  pMVar1->size = size;
  Name::operator=(&pMVar1->memory,(Name *)&this_local);
  wasm::MemoryFill::finalize();
  return pMVar1;
}

Assistant:

MemoryFill* makeMemoryFill(Expression* dest,
                             Expression* value,
                             Expression* size,
                             Name memory) {
    auto* ret = wasm.allocator.alloc<MemoryFill>();
    ret->dest = dest;
    ret->value = value;
    ret->size = size;
    ret->memory = memory;
    ret->finalize();
    return ret;
  }